

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disassembler.cpp
# Opt level: O0

string * Disassembler::jType(string *__return_storage_ptr__,string *bin)

{
  uint line_00;
  bool bVar1;
  int iVar2;
  int line_01;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined4 local_11c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  uint local_d4;
  undefined1 local_d0 [4];
  int line;
  int local_ac;
  undefined1 local_a8 [4];
  int addr;
  undefined1 local_88 [8];
  string label;
  string local_58;
  undefined1 local_38 [8];
  string op;
  string *bin_local;
  
  op.field_2._8_8_ = bin;
  std::__cxx11::string::substr((ulong)&local_58,(ulong)bin);
  AsmFuncts::getOpCode((string *)local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::to_string((string *)local_a8,labelCount);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 "LABEL_",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::substr((ulong)local_d0,(ulong)bin);
  iVar2 = Conversion::binToDec((string *)local_d0);
  std::__cxx11::string::~string((string *)local_d0);
  local_ac = iVar2 * 4;
  iVar2 = local_ac + -0x400000;
  if (local_ac + -0x400000 < 0) {
    iVar2 = local_ac + -0x3ffffd;
  }
  local_d4 = iVar2 >> 2;
  bVar1 = labelExists(local_d4);
  line_00 = local_d4;
  if (bVar1) {
    std::operator+(&local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38," "
                  );
    getLabel_abi_cxx11_(&local_160,(Disassembler *)(ulong)local_d4,line_01);
    std::operator+(__return_storage_ptr__,&local_140,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_140);
  }
  else {
    std::__cxx11::string::string((string *)&local_f8,(string *)local_88);
    addLabel(line_00,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::operator+(&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38," "
                  );
    std::operator+(__return_storage_ptr__,&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    std::__cxx11::string::~string((string *)&local_118);
  }
  local_11c = 1;
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

string Disassembler::jType(string bin){
    string op = AsmFuncts::getOpCode(bin.substr(0,6));
    string label = "LABEL_"+to_string(labelCount);
    int addr = Conversion::binToDec(bin.substr(6,26));
    addr <<= 2;
    int line = (addr-BASE)/4;
    if(!labelExists(line)){
      addLabel(line,label);
      return (op+" "+label);
    }
    else
      return (op+" "+getLabel(line));
}